

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::ConsoleReporter::AssertionPrinter::printResultType(AssertionPrinter *this)

{
  ulong in_RAX;
  ostream *poVar1;
  Colour colourGuard;
  undefined8 uStack_18;
  
  if ((this->passOrFail)._M_string_length != 0) {
    uStack_18 = in_RAX & 0xffffffffffffff;
    Colour::use(this->colour);
    poVar1 = std::operator<<(this->stream,(string *)&this->passOrFail);
    std::operator<<(poVar1,":\n");
    Colour::~Colour((Colour *)((long)&uStack_18 + 7));
  }
  return;
}

Assistant:

Contains( Contains const& other ) : m_data( other.m_data ){}